

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynFunctionDefinition * ParseFunctionDefinition(ParseContext *ctx)

{
  LexemeType LVar1;
  uint uVar2;
  LexemeType LVar3;
  LexemeType LVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  bool *pbVar8;
  SynBase *pSVar9;
  SynBase *pSVar10;
  undefined4 extraout_var;
  Lexeme *pLVar11;
  Lexeme *pLVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Lexeme *pLVar13;
  undefined4 extraout_var_03;
  SynFunctionDefinition *pSVar14;
  undefined4 extraout_var_05;
  char *pcVar15;
  char *pcVar16;
  InplaceStr IVar17;
  IntrusiveList<SynFunctionArgument> IVar18;
  IntrusiveList<SynBase> IVar19;
  SynIdentifier *local_b0;
  bool local_a8;
  IntrusiveList<SynIdentifier> aliases;
  SynIdentifier *local_68;
  SynIdentifier *pSStack_60;
  Lexeme *local_50;
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *local_48;
  TraceScope traceScope;
  undefined4 extraout_var_04;
  
  pLVar13 = ctx->currentLexeme;
  local_68 = (SynIdentifier *)
             CONCAT44(local_68._4_4_,(int)((ulong)((long)pLVar13 - (long)ctx->firstLexeme) >> 5) + 1
                     );
  pbVar8 = SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
                     (&ctx->nonFunctionDefinitionLocations,(uint *)&local_68);
  if (pbVar8 != (bool *)0x0) {
    return (SynFunctionDefinition *)0x0;
  }
  LVar1 = ctx->currentLexeme->type;
  if (LVar1 == lex_coroutine) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
  }
  pSVar9 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar9 == (SynBase *)0x0) {
    if (LVar1 != lex_coroutine) {
      return (SynFunctionDefinition *)0x0;
    }
    pLVar11 = ctx->currentLexeme;
    pcVar15 = "ERROR: function return type not found after \'coroutine\'";
    goto LAB_00113336;
  }
  pLVar12 = ctx->currentLexeme;
  local_48 = &ctx->nonFunctionDefinitionLocations;
  pSVar10 = ParseType(ctx,(bool *)0x0,false);
  pLVar11 = ctx->currentLexeme;
  if (pSVar10 == (SynBase *)0x0) {
    local_a8 = false;
    pSVar10 = (SynBase *)0x0;
  }
  else {
    if (pLVar11->type == lex_point) {
      local_a8 = true;
LAB_00112d74:
      pLVar12 = pLVar11 + 1;
    }
    else {
      if (pLVar11->type == lex_colon) {
        local_a8 = false;
        goto LAB_00112d74;
      }
      local_a8 = false;
      pSVar10 = (SynBase *)0x0;
    }
    ctx->currentLexeme = pLVar12;
    pLVar11 = pLVar12;
  }
  uVar2 = pSVar9->typeID;
  LVar3 = pLVar11->type;
  if (LVar3 == lex_operator) {
    ctx->currentLexeme = pLVar11 + 1;
    LVar4 = pLVar11[1].type;
    if (LVar4 == lex_oparen) {
      ctx->currentLexeme = pLVar11 + 2;
      anon_unknown.dwarf_1519a::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after \'(\' in operator definition");
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_b0 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar7);
      pLVar11 = ParseContext::Previous(ctx);
      pLVar12 = ParseContext::Previous(ctx);
      pcVar15 = "()";
      pcVar16 = "";
    }
    else {
      if (LVar4 != lex_obracket) {
        if (0x22 < LVar4 - lex_add) {
          pcVar15 = "ERROR: invalid operator name";
          pLVar11 = pLVar11 + 1;
          goto LAB_00113336;
        }
        goto LAB_00112ed9;
      }
      ctx->currentLexeme = pLVar11 + 2;
      anon_unknown.dwarf_1519a::CheckConsume
                (ctx,lex_cbracket,"ERROR: \']\' not found after \'[\' in operator definition");
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_b0 = (SynIdentifier *)CONCAT44(extraout_var,iVar7);
      pLVar11 = ParseContext::Previous(ctx);
      pLVar12 = ParseContext::Previous(ctx);
      pcVar15 = "[]";
      pcVar16 = "";
    }
    IVar17.end = pcVar16;
    IVar17.begin = pcVar15;
  }
  else {
    if (LVar3 != lex_string) {
      if (pSVar10 != (SynBase *)0x0) {
        pcVar15 = "ERROR: function name expected after \':\' or \'.\'";
LAB_00113336:
        anon_unknown.dwarf_1519a::Stop(ctx,pLVar11,pcVar15);
      }
      if (LVar1 == lex_coroutine && uVar2 != 5) {
        pcVar15 = "ERROR: function name not found after return type";
        goto LAB_00113336;
      }
      aliases.head = (SynIdentifier *)0x0;
      aliases.tail = (SynIdentifier *)0x0;
      bVar5 = true;
      bVar6 = false;
      local_b0 = (SynIdentifier *)0x0;
      goto LAB_0011304b;
    }
LAB_00112ed9:
    IVar17 = ParseContext::Consume(ctx);
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    local_b0 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar7);
    pLVar11 = ParseContext::Previous(ctx);
    pLVar12 = ParseContext::Previous(ctx);
  }
  SynIdentifier::SynIdentifier(local_b0,pLVar11,pLVar12,IVar17);
  aliases.head = (SynIdentifier *)0x0;
  aliases.tail = (SynIdentifier *)0x0;
  pLVar11 = ctx->currentLexeme;
  if (pLVar11->type == lex_less) {
    do {
      local_50 = pLVar13;
      ctx->currentLexeme = pLVar11 + 1;
      pcVar15 = "ERROR: \'@\' is expected after \',\' in explicit generic type alias list";
      if (aliases.head == (SynIdentifier *)0x0) {
        pcVar15 = "ERROR: \'@\' is expected before explicit generic type alias";
      }
      anon_unknown.dwarf_1519a::CheckConsume(ctx,lex_at,pcVar15);
      bVar6 = anon_unknown.dwarf_1519a::CheckAt
                        (ctx,lex_string,"ERROR: explicit generic type alias is expected after \'@\'"
                        );
      if (bVar6) {
        IVar17 = ParseContext::Consume(ctx);
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pLVar13 = ParseContext::Previous(ctx);
        pLVar11 = ParseContext::Previous(ctx);
        SynIdentifier::SynIdentifier
                  ((SynIdentifier *)CONCAT44(extraout_var_02,iVar7),pLVar13,pLVar11,IVar17);
        IntrusiveList<SynIdentifier>::push_back
                  (&aliases,(SynIdentifier *)CONCAT44(extraout_var_02,iVar7));
      }
      pLVar11 = ctx->currentLexeme;
      pLVar13 = local_50;
    } while (pLVar11->type == lex_comma);
    bVar5 = false;
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_greater,"ERROR: \'>\' not found after explicit generic type alias list");
    bVar6 = aliases.head != (SynIdentifier *)0x0;
    pLVar13 = local_50;
  }
  else {
    bVar6 = false;
    bVar5 = false;
  }
LAB_0011304b:
  if (((LVar1 == lex_coroutine) || (pSVar10 != (SynBase *)0x0)) || (bVar6)) {
    anon_unknown.dwarf_1519a::CheckAt(ctx,lex_oparen,"ERROR: \'(\' expected after function name");
  }
  if (((bool)(uVar2 != 5 & bVar5)) || (ctx->currentLexeme->type != lex_oparen)) {
    ctx->currentLexeme = pLVar13;
    local_68 = (SynIdentifier *)
               CONCAT44(local_68._4_4_,
                        (int)((ulong)((long)pLVar13 - (long)ctx->firstLexeme) >> 5) + 1);
    traceScope.ts._0_1_ = 1;
    SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
              (local_48,(uint *)&local_68,(bool *)&traceScope);
    return (SynFunctionDefinition *)0x0;
  }
  ctx->currentLexeme = ctx->currentLexeme + 1;
  IVar18 = ParseFunctionArguments(ctx);
  anon_unknown.dwarf_1519a::CheckConsume
            (ctx,lex_cparen,"ERROR: \')\' not found after function variable list");
  if (bVar5) {
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])();
    local_b0 = (SynIdentifier *)CONCAT44(extraout_var_03,iVar7);
    SynIdentifier::SynIdentifier(local_b0,(InplaceStr)ZEXT816(0));
  }
  if (ctx->currentLexeme->type != lex_semicolon) {
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after function header");
    if ((ParseFunctionDefinition(ParseContext&)::token == '\0') &&
       (iVar7 = __cxa_guard_acquire(&ParseFunctionDefinition(ParseContext&)::token), iVar7 != 0)) {
      ParseFunctionDefinition::token = NULLC::TraceGetToken("parse","ParseFunctionBody");
      __cxa_guard_release(&ParseFunctionDefinition(ParseContext&)::token);
    }
    NULLC::TraceScope::TraceScope(&traceScope,ParseFunctionDefinition::token);
    NULLC::TraceLabel((local_b0->name).begin,(local_b0->name).end);
    IVar19 = ParseExpressions(ctx);
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after function body");
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
    pSVar14 = (SynFunctionDefinition *)CONCAT44(extraout_var_05,iVar7);
    pLVar11 = ParseContext::Previous(ctx);
    local_68 = aliases.head;
    pSStack_60 = aliases.tail;
    SynBase::SynBase((SynBase *)pSVar14,0x37,pLVar13,pLVar11);
    (pSVar14->super_SynBase).field_0x3b = LVar1 == lex_coroutine;
    (pSVar14->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00223028;
    (pSVar14->super_SynBase).field_0x3a = 0;
    pSVar14->parentType = pSVar10;
    pSVar14->accessor = local_a8;
    pSVar14->returnType = pSVar9;
    pSVar14->isOperator = LVar3 == lex_operator;
    pSVar14->name = local_b0;
    (pSVar14->aliases).head = local_68;
    (pSVar14->aliases).tail = pSStack_60;
    pSVar14->arguments = IVar18;
    pSVar14->expressions = IVar19;
    NULLC::TraceScope::~TraceScope(&traceScope);
    return pSVar14;
  }
  ctx->currentLexeme = ctx->currentLexeme + 1;
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
  pSVar14 = (SynFunctionDefinition *)CONCAT44(extraout_var_04,iVar7);
  pLVar11 = ParseContext::Previous(ctx);
  local_68 = aliases.head;
  pSStack_60 = aliases.tail;
  SynBase::SynBase((SynBase *)pSVar14,0x37,pLVar13,pLVar11);
  (pSVar14->super_SynBase).field_0x3b = LVar1 == lex_coroutine;
  (pSVar14->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00223028;
  (pSVar14->super_SynBase).field_0x3a = 1;
  pSVar14->parentType = pSVar10;
  pSVar14->accessor = local_a8;
  pSVar14->returnType = pSVar9;
  pSVar14->isOperator = LVar3 == lex_operator;
  pSVar14->name = local_b0;
  (pSVar14->aliases).head = local_68;
  (pSVar14->aliases).tail = pSStack_60;
  pSVar14->arguments = IVar18;
  (pSVar14->expressions).head = (SynBase *)0x0;
  (pSVar14->expressions).tail = (SynBase *)0x0;
  return pSVar14;
}

Assistant:

SynFunctionDefinition* ParseFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonFunctionDefinitionLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool coroutine = ctx.Consume(lex_coroutine);

	if(SynBase *returnType = ParseType(ctx))
	{
		// Check if this is a member function
		Lexeme *subLexeme = ctx.currentLexeme;

		SynBase *parentType = ParseType(ctx);
		bool accessor = false;

		if(parentType)
		{
			if(ctx.Consume(lex_colon))
			{
				accessor = false;
			}
			else if(ctx.Consume(lex_point))
			{
				accessor = true;
			}
			else
			{
				// Backtrack
				ctx.currentLexeme = subLexeme;

				parentType = NULL;
			}
		}

		bool allowEmptyName = isType<SynTypeAuto>(returnType);

		bool isOperator = ctx.Consume(lex_operator);

		SynIdentifier *nameIdentifier = NULL;

		if(isOperator)
		{
			if(ctx.Consume(lex_obracket))
			{
				CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after '[' in operator definition");

				InplaceStr name = InplaceStr("[]");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if(ctx.Consume(lex_oparen))
			{
				CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after '(' in operator definition");

				InplaceStr name = InplaceStr("()");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if((ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				Stop(ctx, ctx.Current(), "ERROR: invalid operator name");
			}
		}
		else if(ctx.At(lex_string))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else if(parentType)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name expected after ':' or '.'");
		}
		else if(coroutine && !allowEmptyName)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name not found after return type");
		}

		IntrusiveList<SynIdentifier> aliases;

		if(nameIdentifier && ctx.Consume(lex_less))
		{
			do
			{
				if(aliases.empty())
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected before explicit generic type alias");
				else
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected after ',' in explicit generic type alias list");

				if(CheckAt(ctx, lex_string, "ERROR: explicit generic type alias is expected after '@'"))
				{
					InplaceStr name = ctx.Consume();
					aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name));
				}
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, lex_greater, "ERROR: '>' not found after explicit generic type alias list");
		}

		if(parentType || coroutine || !aliases.empty())
			CheckAt(ctx, lex_oparen, "ERROR: '(' expected after function name");

		if((nameIdentifier == NULL && !allowEmptyName) || !ctx.Consume(lex_oparen))
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonFunctionDefinitionLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}

		IntrusiveList<SynFunctionArgument> arguments = ParseFunctionArguments(ctx);

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function variable list");

		if(!nameIdentifier)
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_semicolon))
			return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), true, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after function header");

		TRACE_SCOPE("parse", "ParseFunctionBody");

		if(nameIdentifier)
			TRACE_LABEL2(nameIdentifier->name.begin, nameIdentifier->name.end);

		expressions = ParseExpressions(ctx);

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");

		return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), false, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);
	}
	else if(coroutine)
	{
		Stop(ctx, ctx.Current(), "ERROR: function return type not found after 'coroutine'");
	}

	return NULL;
}